

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O2

bool __thiscall ON_ParseSettings::IsLeadingWhiteSpace(ON_ParseSettings *this,ON__UINT32 c)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = IsInteriorWhiteSpace(this,c);
  bVar3 = true;
  if (bVar2) {
    return true;
  }
  switch(c) {
  case 10:
    bVar1 = (byte)this->m_true_default_bits[1] & 2;
    break;
  case 0xb:
    bVar1 = (byte)this->m_true_default_bits[1] & 4;
    break;
  case 0xc:
    if (-1 < (int)this->m_true_default_bits[0]) {
      return true;
    }
    goto switchD_00574ddd_default;
  case 0xd:
    bVar1 = (byte)this->m_true_default_bits[1] & 1;
    break;
  default:
    goto switchD_00574ddd_default;
  }
  if (bVar1 != 0) {
switchD_00574ddd_default:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_ParseSettings::IsLeadingWhiteSpace(ON__UINT32 c) const
{
  if (IsInteriorWhiteSpace(c))
    return true;

  switch(c)
  {
  case 0x000A: // line feed
    if ( ParseLineFeedAsLeadingWhiteSpace() )
      return true;
    break;

  case 0x000B: // vertical tab
    if ( ParseVerticalTabAsLeadingWhiteSpace() )
      return true;
    break;

  case 0x000C: // form feed
    if ( ParseFormFeedAsLeadingWhiteSpace() )
      return true;
    break;

  case 0x000D: // carriage return
    if ( ParseCarriageReturnAsLeadingWhiteSpace() )
      return true;
    break;
  }

  return false;
}